

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process-list.cpp
# Opt level: O1

void __thiscall dynamicgraph::CPU::System::readProcStat(System *this)

{
  uint uVar1;
  char cVar2;
  istream *piVar3;
  long lVar4;
  pointer pCVar5;
  ulong uVar6;
  uint lcpunb;
  string line_hdr;
  string str_cpunbr;
  ifstream aif;
  istringstream iss;
  istringstream anISSLine;
  uint local_59c;
  undefined1 *local_598;
  undefined8 local_590;
  undefined1 local_588;
  undefined7 uStack_587;
  undefined1 *local_578;
  undefined8 local_570;
  undefined1 local_568;
  undefined7 uStack_567;
  long *local_558;
  long local_550;
  long local_548 [2];
  long local_538 [65];
  istringstream local_330 [120];
  ios_base local_2b8 [264];
  istringstream local_1b0 [120];
  ios_base local_138 [264];
  
  std::ifstream::ifstream(local_538);
  this->cpuNb_ = 1;
  std::ifstream::open((char *)local_538,0x126098);
  local_578 = &local_568;
  local_570 = 0;
  local_568 = 0;
  while( true ) {
    cVar2 = std::ios::widen((char)*(undefined8 *)(local_538[0] + -0x18) + (char)(istream *)local_538
                           );
    piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)local_538,(string *)&local_578,cVar2);
    if (((byte)piVar3[*(long *)(*(long *)piVar3 + -0x18) + 0x20] & 5) != 0) break;
    std::__cxx11::istringstream::istringstream(local_1b0,(string *)&local_578,_S_in);
    local_598 = &local_588;
    local_590 = 0;
    local_588 = 0;
    std::operator>>((istream *)local_1b0,(string *)&local_598);
    lVar4 = std::__cxx11::string::find((char *)&local_598,0x1260a3,0);
    std::__cxx11::string::substr((ulong)&local_558,(ulong)&local_598);
    if (lVar4 == 0) {
      if (local_550 == 0) {
        CPUData::ProcessLine(&this->gCPUData_,(istringstream *)local_1b0);
        (this->gCPUData_).cpu_id_ = -1;
      }
      else {
        std::__cxx11::istringstream::istringstream(local_330,(string *)&local_558,_S_in);
        std::istream::_M_extract<unsigned_int>((uint *)local_330);
        if (this->init_ == false) {
          if (this->cpuNb_ < local_59c) {
            this->cpuNb_ = local_59c;
          }
        }
        else {
          CPUData::ProcessLine
                    ((this->vCPUData_).
                     super__Vector_base<dynamicgraph::CPU::CPUData,_std::allocator<dynamicgraph::CPU::CPUData>_>
                     ._M_impl.super__Vector_impl_data._M_start + local_59c,
                     (istringstream *)local_1b0);
        }
        std::__cxx11::istringstream::~istringstream(local_330);
        std::ios_base::~ios_base(local_2b8);
      }
    }
    if (local_558 != local_548) {
      operator_delete(local_558,local_548[0] + 1);
    }
    if (local_598 != &local_588) {
      operator_delete(local_598,CONCAT71(uStack_587,local_588) + 1);
    }
    std::__cxx11::istringstream::~istringstream(local_1b0);
    std::ios_base::~ios_base(local_138);
  }
  if (this->init_ == false) {
    std::vector<dynamicgraph::CPU::CPUData,_std::allocator<dynamicgraph::CPU::CPUData>_>::resize
              (&this->vCPUData_,(ulong)(this->cpuNb_ + 1));
    uVar1 = this->cpuNb_;
    if ((ulong)uVar1 != 0) {
      pCVar5 = (this->vCPUData_).
               super__Vector_base<dynamicgraph::CPU::CPUData,_std::allocator<dynamicgraph::CPU::CPUData>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar6 = 0;
      do {
        pCVar5->cpu_id_ = (int)uVar6;
        uVar6 = uVar6 + 1;
        pCVar5 = pCVar5 + 1;
      } while (uVar1 != uVar6);
    }
  }
  std::ifstream::close();
  if (local_578 != &local_568) {
    operator_delete(local_578,CONCAT71(uStack_567,local_568) + 1);
  }
  std::ifstream::~ifstream(local_538);
  return;
}

Assistant:

void System::readProcStat() {
  std::ifstream aif;
  cpuNb_ = 1;

  aif.open("/proc/stat", std::ifstream::in);
  std::string aline;
  aline.clear();
  while (std::getline(aif, aline)) {
    // Read on line of the file
    std::istringstream anISSLine(aline);
    std::string line_hdr;
    anISSLine >> line_hdr;

    // Check if the line start with cpu
    std::size_t pos = line_hdr.find("cpu");
    std::string str_cpunbr = line_hdr.substr(pos + 3);

    // Check if this is the  first line
    if (pos == 0 and str_cpunbr.empty()) {
      gCPUData_.ProcessLine(anISSLine);
      gCPUData_.cpu_id_ = -1;
    } else {
      // If not then check if there is a CPU number
      if (pos == 0) {
        std::istringstream iss(str_cpunbr);
        unsigned int lcpunb;
        iss >> lcpunb;
        // If we did not initialize
        if (!init_) {
          // Count the number of CPU.
          if (lcpunb > cpuNb_) cpuNb_ = lcpunb;
        } else
          // Otherwise process the line.
          ProcessCPULine(lcpunb, anISSLine);
      }
    }
  }

  if (!init_) {
    /// The number of CPU has been detected by going through /proc/stat.
    vCPUData_.resize(cpuNb_ + 1);
    for (unsigned long i = 0; i < (unsigned long)cpuNb_; i++)
      vCPUData_[i].cpu_id_ = (int)i;
  }
  aif.close();
}